

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaANCF_3813::ComputeMassMatrix(ChElementHexaANCF_3813 *this)

{
  ChMatrixNM<double,_24,_24> *result;
  undefined1 auVar1 [16];
  ActualDstType actualDst;
  undefined1 auVar2 [64];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Brick_Mass myformula;
  mul_assign_op<double,_double> local_499;
  DstEvaluatorType local_498;
  SrcEvaluatorType local_490;
  undefined1 local_480 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
  local_420;
  Brick_Mass local_400;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (((this->m_Material).
                   super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChContinuumMaterial).density;
  local_480 = vbroadcastsd_avx512f(auVar1);
  Brick_Mass::Brick_Mass(&local_400,&this->m_d0,this);
  result = &this->m_MassMatrix;
  memset(result,0,0x1200);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,24,24,1,24,24>>
            (result,&local_400.super_ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,-1.0,
             1.0,-1.0,1.0,-1.0,1.0,2);
  local_420.m_src = &local_490;
  local_490.m_functor.m_other = (double)vmovlpd_avx(local_480._0_16_);
  local_420.m_dst = &local_498;
  local_420.m_functor = &local_499;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           (this->m_MassMatrix).
                           super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                           m_storage.m_data.array);
  *(undefined1 (*) [64])
   (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
   m_data.array = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 8));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 8) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x10));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x10) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x18));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x18) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x20));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x20) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x28));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x28) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x30));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x30) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x38));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x38) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x40));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x40) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x48));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x48) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x50));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x50) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x58));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x58) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x60));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x60) = auVar2;
  auVar2 = vmulpd_avx512f(local_480,
                          *(undefined1 (*) [64])
                           ((this->m_MassMatrix).
                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                            m_storage.m_data.array + 0x68));
  *(undefined1 (*) [64])
   ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array + 0x68) = auVar2;
  local_498.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>)result;
  local_420.m_dstExpr = result;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run(&local_420);
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeMassMatrix() {
    double rho = m_Material->Get_density();
    Brick_Mass myformula(&m_d0, this);
    m_MassMatrix.setZero();
    ChQuadrature::Integrate3D<ChMatrixNM<double, 24, 24>>(m_MassMatrix,  // result of integration will go there
                                                          myformula,     // formula to integrate
                                                          -1,            // start of x
                                                          1,             // end of x
                                                          -1,            // start of y
                                                          1,             // end of y
                                                          -1,            // start of z
                                                          1,             // end of z
                                                          2              // order of integration
    );

    m_MassMatrix *= rho;
}